

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_vacuum.cpp
# Opt level: O3

void __thiscall
duckdb::VacuumLocalSinkState::VacuumLocalSinkState
          (VacuumLocalSinkState *this,VacuumInfo *info,
          optional_ptr<duckdb::TableCatalogEntry,_true> table)

{
  pointer pbVar1;
  _Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_> _Var2;
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar3;
  vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  *pvVar4;
  undefined8 uVar5;
  bool bVar6;
  ColumnDefinition *this_00;
  unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_> this_01;
  pointer name;
  LogicalType local_78;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_60;
  Vector *local_58;
  VacuumLocalSinkState *local_50;
  LogicalType local_48;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar3 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar3->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__VacuumLocalSinkState_0245a300;
  pvVar4 = &(this->column_distinct_stats).
            super_vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  ;
  (pvVar4->
  super__Vector_base<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar4->
  super__Vector_base<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_distinct_stats).
  super_vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.ptr = table.ptr;
  local_50 = this;
  LogicalType::LogicalType(&local_48,UBIGINT);
  local_58 = &this->hashes;
  Vector::Vector(local_58,&local_48,0x800);
  LogicalType::~LogicalType(&local_48);
  name = (info->columns).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (info->columns).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (name != pbVar1) {
    do {
      optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_60);
      this_00 = TableCatalogEntry::GetColumn(local_60.ptr,name);
      ColumnDefinition::GetType(&local_78,this_00);
      bVar6 = DistinctStatistics::TypeIsSupported(&local_78);
      LogicalType::~LogicalType(&local_78);
      if (bVar6) {
        this_01._M_t.
        super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
        .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
             (__uniq_ptr_data<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true,_true>
              )operator_new(0x18);
        DistinctStatistics::DistinctStatistics
                  ((DistinctStatistics *)
                   this_01._M_t.
                   super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
                   .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl);
        local_78._0_8_ =
             this_01._M_t.
             super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
             .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>>
                    *)&this->column_distinct_stats,
                   (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
                    *)&local_78);
      }
      else {
        local_78._0_8_ =
             (tuple<duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>)
             0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>>
                    *)&this->column_distinct_stats,
                   (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
                    *)&local_78);
      }
      uVar5 = local_78._0_8_;
      if ((DistinctStatistics *)local_78._0_8_ != (DistinctStatistics *)0x0) {
        _Var2.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
             (((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> *)
              local_78._0_8_)->
             super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)._M_t.
             super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>
             .super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>;
        if (_Var2.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl !=
            (HyperLogLog *)0x0) {
          operator_delete((void *)_Var2.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>.
                                  _M_head_impl);
        }
        operator_delete((void *)uVar5);
      }
      name = name + 1;
    } while (name != pbVar1);
  }
  return;
}

Assistant:

explicit VacuumLocalSinkState(VacuumInfo &info, optional_ptr<TableCatalogEntry> table) : hashes(LogicalType::HASH) {
		for (const auto &column_name : info.columns) {
			auto &column = table->GetColumn(column_name);
			if (DistinctStatistics::TypeIsSupported(column.GetType())) {
				column_distinct_stats.push_back(make_uniq<DistinctStatistics>());
			} else {
				column_distinct_stats.push_back(nullptr);
			}
		}
	}